

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O0

MPP_RET mpp_check_support_format(MppCtxType type,MppCodingType coding)

{
  MppCodingTypeInfo *info;
  RK_U32 i;
  MPP_RET ret;
  MppCodingType coding_local;
  MppCtxType type_local;
  
  info._0_4_ = 0;
  while( true ) {
    if (0xf < (uint)info) {
      return MPP_NOK;
    }
    if ((type == support_list[(uint)info].type) && (coding == support_list[(uint)info].coding))
    break;
    info._0_4_ = (uint)info + 1;
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_check_support_format(MppCtxType type, MppCodingType coding)
{
    MPP_RET ret = MPP_NOK;
    RK_U32 i = 0;

    for (i = 0; i < MPP_ARRAY_ELEMS(support_list); i++) {
        MppCodingTypeInfo *info = &support_list[i];
        if (type    == info->type &&
            coding  == info->coding) {
            ret = MPP_OK;
            break;
        }
    }
    return ret;
}